

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xmlwrite_mode(archive_write *a,xml_writer *writer,char *key,mode_t mode)

{
  int iVar1;
  char local_29;
  char local_28;
  char local_27;
  char local_26;
  undefined1 local_25;
  undefined1 auStack_24 [3];
  char ms [5];
  mode_t mode_local;
  char *key_local;
  xml_writer *writer_local;
  archive_write *a_local;
  
  local_29 = '0';
  local_28 = ((byte)(mode >> 6) & 7) + 0x30;
  local_27 = ((byte)(mode >> 3) & 7) + 0x30;
  local_26 = ((byte)mode & 7) + 0x30;
  local_25 = 0;
  _auStack_24 = mode;
  unique0x10000039 = key;
  iVar1 = xmlwrite_string(a,writer,key,&local_29);
  return iVar1;
}

Assistant:

static int
xmlwrite_mode(struct archive_write *a, struct xml_writer *writer,
	const char *key, mode_t mode)
{
	char ms[5];

	ms[0] = '0';
	ms[1] = '0' + ((mode >> 6) & 07);
	ms[2] = '0' + ((mode >> 3) & 07);
	ms[3] = '0' + (mode & 07);
	ms[4] = '\0';

	return (xmlwrite_string(a, writer, key, ms));
}